

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

void __thiscall icu_63::RegexCompile::insertOp(RegexCompile *this,int32_t where)

{
  UVector64 *this_00;
  int32_t iVar1;
  uint type;
  uint uVar2;
  int64_t iVar3;
  int32_t x;
  int32_t opValue;
  int32_t opType;
  int32_t op;
  int32_t loc;
  int32_t nop;
  UVector64 *code;
  int32_t where_local;
  RegexCompile *this_local;
  
  this_00 = this->fRXPat->fCompiledPat;
  iVar1 = buildOp(this,7,0);
  UVector64::insertElementAt(this_00,(long)iVar1,where,this->fStatus);
  opType = 0;
  while( true ) {
    iVar1 = UVector64::size(this_00);
    if (iVar1 <= opType) break;
    iVar3 = UVector64::elementAti(this_00,opType);
    type = (uint)iVar3 >> 0x18;
    uVar2 = (uint)iVar3 & 0xffffff;
    if ((((((type == 0xd) || (type == 0x24)) || (type == 6)) || ((type == 0x1c || (type == 0x1d))))
        || ((type == 0xf || ((type == 0x12 || (type == 0x1f)))))) && (where < (int)uVar2)) {
      iVar1 = buildOp(this,type,uVar2 + 1);
      UVector64::setElementAt(this_00,(long)iVar1,opType);
    }
    opType = opType + 1;
  }
  opType = 0;
  while( true ) {
    iVar1 = UVector32::size(&this->fParenStack);
    if (iVar1 <= opType) break;
    iVar1 = UVector32::elementAti(&this->fParenStack,opType);
    if (where < iVar1) {
      UVector32::setElementAt(&this->fParenStack,iVar1 + 1,opType);
    }
    opType = opType + 1;
  }
  if (where < this->fMatchCloseParen) {
    this->fMatchCloseParen = this->fMatchCloseParen + 1;
  }
  if (where < this->fMatchOpenParen) {
    this->fMatchOpenParen = this->fMatchOpenParen + 1;
  }
  return;
}

Assistant:

void   RegexCompile::insertOp(int32_t where) {
    UVector64 *code = fRXPat->fCompiledPat;
    U_ASSERT(where>0 && where < code->size());

    int32_t  nop = buildOp(URX_NOP, 0);
    code->insertElementAt(nop, where, *fStatus);

    // Walk through the pattern, looking for any ops with targets that
    //  were moved down by the insert.  Fix them.
    int32_t loc;
    for (loc=0; loc<code->size(); loc++) {
        int32_t op = (int32_t)code->elementAti(loc);
        int32_t opType = URX_TYPE(op);
        int32_t opValue = URX_VAL(op);
        if ((opType == URX_JMP         ||
            opType == URX_JMPX         ||
            opType == URX_STATE_SAVE   ||
            opType == URX_CTR_LOOP     ||
            opType == URX_CTR_LOOP_NG  ||
            opType == URX_JMP_SAV      ||
            opType == URX_JMP_SAV_X    ||
            opType == URX_RELOC_OPRND)    && opValue > where) {
            // Target location for this opcode is after the insertion point and
            //   needs to be incremented to adjust for the insertion.
            opValue++;
            op = buildOp(opType, opValue);
            code->setElementAt(op, loc);
        }
    }

    // Now fix up the parentheses stack.  All positive values in it are locations in
    //  the compiled pattern.   (Negative values are frame boundaries, and don't need fixing.)
    for (loc=0; loc<fParenStack.size(); loc++) {
        int32_t x = fParenStack.elementAti(loc);
        U_ASSERT(x < code->size());
        if (x>where) {
            x++;
            fParenStack.setElementAt(x, loc);
        }
    }

    if (fMatchCloseParen > where) {
        fMatchCloseParen++;
    }
    if (fMatchOpenParen > where) {
        fMatchOpenParen++;
    }
}